

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O0

int ZXing::Pdf417::Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n)

{
  int n_local;
  undefined4 local_4;
  
  if (n < 0x29) {
    local_4 = 2;
  }
  else if (n < 0xa1) {
    local_4 = 3;
  }
  else if (n < 0x141) {
    local_4 = 4;
  }
  else if (n < 0x360) {
    local_4 = 5;
  }
  else {
    local_4 = 6;
  }
  return local_4;
}

Assistant:

int
Encoder::GetRecommendedMinimumErrorCorrectionLevel(int n) {
	if (n <= 40) {
		return 2;
	}
	if (n <= 160) {
		return 3;
	}
	if (n <= 320) {
		return 4;
	}
	if (n <= 863) {
		return 5;
	}
	return 6;
}